

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

void Corrade::Containers::arrayResize<char,Corrade::Containers::ArrayMallocAllocator<char>>
               (Array *array,ArrayGuts<char> *param_2)

{
  char *pcVar1;
  ArrayGuts<char> *pAVar2;
  ArrayGuts<char> *local_78;
  ArrayGuts<char> *local_68;
  Array<char,_void_(*)(char_*,_unsigned_long)> local_50;
  char *local_38;
  char *newArray;
  Array *pAStack_28;
  bool hasGrowingDeleter;
  ArrayGuts<char> *arrayGuts;
  size_t size_local;
  Array<char,_void_(*)(char_*,_unsigned_long)> *array_local;
  
  newArray._7_1_ = *(code **)(array + 0x10) == ArrayMallocAllocator<char>::deleter;
  if (*(ArrayGuts<char> **)(array + 8) != param_2) {
    pAStack_28 = array;
    arrayGuts = param_2;
    size_local = (size_t)array;
    if ((bool)newArray._7_1_) {
      pcVar1 = Array::operator_cast_to_char_(array);
      pAVar2 = (ArrayGuts<char> *)ArrayMallocAllocator<char>::capacity(pcVar1);
      if (pAVar2 < arrayGuts) {
        if (*(ArrayGuts<char> **)(pAStack_28 + 8) < arrayGuts) {
          local_78 = *(ArrayGuts<char> **)(pAStack_28 + 8);
        }
        else {
          local_78 = arrayGuts;
        }
        ArrayMallocAllocator<char>::reallocate
                  ((char **)pAStack_28,(size_t)local_78,(size_t)arrayGuts);
        *(ArrayGuts<char> **)(pAStack_28 + 8) = arrayGuts;
      }
      else {
        Implementation::arrayDestruct<char,_0>
                  ((char *)((long)&arrayGuts->data + *(long *)pAStack_28),
                   (char *)(*(long *)pAStack_28 + *(long *)(pAStack_28 + 8)));
        *(ArrayGuts<char> **)(pAStack_28 + 8) = arrayGuts;
      }
    }
    else {
      local_38 = ArrayMallocAllocator<char>::allocate((size_t)param_2);
      pcVar1 = Array::operator_cast_to_char_((Array *)size_local);
      if (*(ArrayGuts<char> **)(pAStack_28 + 8) < arrayGuts) {
        local_68 = *(ArrayGuts<char> **)(pAStack_28 + 8);
      }
      else {
        local_68 = arrayGuts;
      }
      Implementation::arrayMoveConstruct<char,_0>(pcVar1,local_38,(size_t)local_68);
      Array<char,_void_(*)(char_*,_unsigned_long)>::Array
                (&local_50,local_38,(size_t)arrayGuts,ArrayMallocAllocator<char>::deleter);
      Array<char,_void_(*)(char_*,_unsigned_long)>::operator=
                ((Array<char,_void_(*)(char_*,_unsigned_long)> *)size_local,&local_50);
      Array<char,_void_(*)(char_*,_unsigned_long)>::~Array(&local_50);
    }
  }
  return;
}

Assistant:

void arrayResize(Array<T>& array, Corrade::NoInitT, const std::size_t size) {
    /* Direct access & value caching to speed up debug builds */
    auto& arrayGuts = reinterpret_cast<Implementation::ArrayGuts<T>&>(array);
    const bool hasGrowingDeleter = arrayGuts.deleter == Allocator::deleter;

    /* New size is the same as the old one, nothing to do */
    if(arrayGuts.size == size) return;

    /* Reallocate if we don't have our growable deleter, as the default deleter
       might then call destructors even in the non-initialized area ... */
    if(!hasGrowingDeleter) {
        T* newArray = Allocator::allocate(size);
        Implementation::arrayMoveConstruct<T>(array, newArray,
            /* Move the min of the two sizes -- if we shrink, move only what
               will fit in the new array; if we extend, move only what's
               initialized in the original and left the rest not initialized */
            arrayGuts.size < size ? arrayGuts.size : size);
        array = Array<T>{newArray, size, Allocator::deleter};

        #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
        /* This should basically be a no-op, right? */
        __sanitizer_annotate_contiguous_container(
            Allocator::base(arrayGuts.data),
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size);
        #endif

    /* ... or the desired size is larger than the capacity. In that case make
       use of the reallocate() function that might be able to grow in-place. */
    } else if(Allocator::capacity(array) < size) {
        Allocator::reallocate(arrayGuts.data,
            /* Move the min of the two sizes -- if we shrink, move only what
               will fit in the new array; if we extend, move only what's
               initialized in the original and left the rest not initialized */
            arrayGuts.size < size ? arrayGuts.size : size, size);
        arrayGuts.size = size;

        #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
        /** @todo with std::realloc, is that really a new allocation? what
            should I do here? */
        /* This should basically be a no-op, right? */
        __sanitizer_annotate_contiguous_container(
            Allocator::base(arrayGuts.data),
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + arrayGuts.size);
        #endif

    /* Otherwise call a destructor on the extra elements. If we get here, we
       have our growable deleter and didn't need to reallocate (which would
       make this unnecessary). */
    } else {
        Implementation::arrayDestruct<T>(arrayGuts.data + size, arrayGuts.data + arrayGuts.size);
        /* This is a NoInit resize, so not constructing the new elements, only
           updating the size */
        #ifdef _CORRADE_CONTAINERS_SANITIZER_ENABLED
        __sanitizer_annotate_contiguous_container(
            Allocator::base(arrayGuts.data),
            arrayGuts.data + Allocator::capacity(array),
            arrayGuts.data + arrayGuts.size,
            arrayGuts.data + size);
        #endif
        arrayGuts.size = size;
    }
}